

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# c2mir.c
# Opt level: O1

void process_func_decls_for_allocation(c2m_ctx_t c2m_ctx)

{
  uchar uVar1;
  node_code_t nVar2;
  check_ctx *pcVar3;
  decl_t *ppdVar4;
  decl_t pdVar5;
  undefined1 *puVar6;
  node_t_conflict pnVar7;
  undefined1 *puVar8;
  char *pcVar9;
  ulong uVar10;
  node_t pnVar11;
  byte *pbVar12;
  int iVar13;
  VARR_decl_t *pVVar14;
  VARR_decl_t *extraout_RAX;
  mir_size_t mVar15;
  mir_size_t mVar16;
  ulong extraout_RAX_00;
  ulong uVar17;
  type *el;
  arr_type *paVar18;
  node_t_conflict pnVar19;
  decl_spec *pdVar20;
  type *ptVar21;
  int extraout_EDX;
  long lVar22;
  int *piVar23;
  int *in_RSI;
  int *piVar24;
  node_t_conflict pnVar25;
  c2m_ctx_t c2m_ctx_00;
  ulong uVar26;
  int *unaff_R14;
  int *unaff_R15;
  bool bVar27;
  pos_t pVar28;
  node_t_conflict local_48;
  long local_40;
  
  pcVar3 = c2m_ctx->check_ctx;
  pVVar14 = pcVar3->func_decls_for_allocation;
  if (pVVar14 != (VARR_decl_t *)0x0) {
    unaff_R14 = (int *)0x0;
    piVar23 = (int *)0x0;
    c2m_ctx_00 = c2m_ctx;
    do {
      unaff_R15 = (int *)pVVar14->els_num;
      piVar24 = in_RSI;
      if (unaff_R15 <= piVar23) goto LAB_0018851a;
      ppdVar4 = pVVar14->varr;
      if (ppdVar4 == (decl_t *)0x0) {
        process_func_decls_for_allocation_cold_6();
        goto LAB_001886dd;
      }
      pdVar5 = ppdVar4[(long)piVar23];
      c2m_ctx_00 = (c2m_ctx_t)(pdVar5->decl_spec).type;
      iVar13 = scalar_type_p((type *)c2m_ctx_00);
      if (iVar13 == 0) {
        if (unaff_R15 <= unaff_R14) goto LAB_001886e2;
        ppdVar4[(long)unaff_R14] = pdVar5;
        unaff_R14 = (int *)((long)unaff_R14 + 1);
      }
      else {
        *(byte *)pdVar5 = *(byte *)pdVar5 | 2;
      }
      piVar23 = (int *)((long)piVar23 + 1);
      pVVar14 = pcVar3->func_decls_for_allocation;
    } while (pVVar14 != (VARR_decl_t *)0x0);
  }
  process_func_decls_for_allocation_cold_7();
  pVVar14 = extraout_RAX;
  piVar24 = in_RSI;
LAB_0018851a:
  in_RSI = unaff_R14;
  c2m_ctx_00 = (c2m_ctx_t)pVVar14->varr;
  if ((c2m_ctx_00 != (c2m_ctx_t)0x0) && (in_RSI <= unaff_R15)) {
    pVVar14->els_num = (size_t)in_RSI;
    qsort(c2m_ctx_00,(size_t)in_RSI,8,decl_cmp);
    pVVar14 = pcVar3->func_decls_for_allocation;
    if (pVVar14 != (VARR_decl_t *)0x0) {
      local_40 = 0;
      local_48 = (node_t_conflict)0x0;
      uVar26 = 0;
      do {
        uVar17 = pVVar14->els_num;
        if (uVar17 <= uVar26) goto LAB_00188666;
        if (pVVar14->varr == (decl_t *)0x0) goto LAB_001886dd;
        pdVar5 = pVVar14->varr[uVar26];
        pnVar25 = pdVar5->scope;
        ptVar21 = (pdVar5->decl_spec).type;
        puVar6 = (undefined1 *)pnVar25->attr;
        if (pnVar25 != local_48) {
          pnVar7 = c2m_ctx->top_scope;
          pnVar19 = *(node_t_conflict *)(puVar6 + 0x20);
          if (pnVar19 != pnVar7) {
            lVar22 = *(long *)(puVar6 + 0x10);
            do {
              puVar8 = (undefined1 *)pnVar19->attr;
              lVar22 = lVar22 + *(long *)(puVar8 + 8);
              *puVar8 = 1;
              pnVar19 = *(node_t_conflict *)(puVar8 + 0x20);
            } while (pnVar19 != pnVar7);
            *(long *)(puVar6 + 0x10) = lVar22;
          }
          *puVar6 = 1;
          local_40 = *(long *)(puVar6 + 0x10);
          local_48 = pnVar25;
        }
        lVar22 = *(long *)(puVar6 + 0x10);
        mVar15 = var_align(c2m_ctx,ptVar21);
        uVar17 = lVar22 + -1 + mVar15;
        mVar15 = uVar17 - uVar17 % mVar15;
        *(mir_size_t *)(puVar6 + 0x10) = mVar15;
        pdVar5->offset = mVar15;
        mVar15 = raw_type_size(c2m_ctx,ptVar21);
        c2m_ctx_00 = c2m_ctx;
        mVar16 = var_align(c2m_ctx,ptVar21);
        uVar17 = (mVar15 - 1) + mVar16;
        lVar22 = (uVar17 - uVar17 % mVar16) + *(long *)(puVar6 + 0x10);
        *(long *)(puVar6 + 0x10) = lVar22;
        in_RSI = (int *)(lVar22 - local_40);
        *(int **)(puVar6 + 8) = in_RSI;
        uVar26 = uVar26 + 1;
        pVVar14 = pcVar3->func_decls_for_allocation;
      } while (pVVar14 != (VARR_decl_t *)0x0);
    }
    process_func_decls_for_allocation_cold_3();
    uVar17 = extraout_RAX_00;
LAB_00188666:
    if (uVar17 == 0) {
      return;
    }
    ppdVar4 = pVVar14->varr;
    if (ppdVar4 != (decl_t *)0x0) {
      pnVar25 = (node_t_conflict)0x0;
      uVar26 = 0;
      do {
        pnVar7 = ppdVar4[uVar26]->scope;
        if (pnVar7 != pnVar25) {
          pcVar9 = (char *)pnVar7->attr;
          pnVar7 = c2m_ctx->top_scope;
          pnVar25 = *(node_t_conflict *)(pcVar9 + 0x20);
          if (pnVar25 != pnVar7) {
            uVar10 = *(ulong *)(pcVar9 + 0x10);
            do {
              puVar6 = (undefined1 *)pnVar25->attr;
              if (*(ulong *)(puVar6 + 8) < uVar10) {
                *(ulong *)(puVar6 + 8) = uVar10;
              }
              if (*pcVar9 != '\0') {
                *puVar6 = 1;
              }
              pnVar25 = *(node_t_conflict *)(puVar6 + 0x20);
            } while (pnVar25 != pnVar7);
          }
        }
        uVar26 = uVar26 + 1;
      } while (uVar26 != uVar17);
      return;
    }
    goto LAB_001886ec;
  }
LAB_001886e7:
  in_RSI = piVar24;
  process_func_decls_for_allocation_cold_4();
LAB_001886ec:
  process_func_decls_for_allocation_cold_1();
  lVar22 = *(long *)(in_RSI + 8);
  if (lVar22 != 0) {
    lVar22 = *(long *)(lVar22 + 0x18);
  }
  if (*in_RSI != 0x5d) {
    __assert_fail("r->code == N_DECL",
                  "/workspace/llm4binary/github/license_c_cmakelists/dibyendumajumdar[P]ravi/mir/c2mir/c2mir.c"
                  ,0x1b49,"struct type *check_declarator(c2m_ctx_t, node_t, int)");
  }
  pnVar25 = *(node_t_conflict *)(lVar22 + 0x20);
  if (pnVar25 != (node_t_conflict)0x0) {
    pcVar3 = c2m_ctx_00->check_ctx;
    ptVar21 = (type *)0x0;
    do {
      el = (type *)reg_malloc(c2m_ctx_00,0x38);
      *(byte *)&el->type_qual = *(byte *)&el->type_qual & 0xf0;
      el->mode = TM_UNDEF;
      el->pos_node = (node_t_conflict)0x0;
      el->arr_type = (type *)0x0;
      el->antialias = 0;
      el->align = -1;
      el->raw_size = 0xffffffffffffffff;
      el->func_type_before_adjustment_p = '\0';
      el->unnamed_anon_struct_union_member_type_p = '\0';
      el->pos_node = pnVar25;
      nVar2 = pnVar25->code;
      if (nVar2 == N_FUNC) {
        pnVar11 = (pnVar25->u).ops.head;
        pnVar7 = (pnVar11->u).ops.tail;
        uVar1 = pcVar3->in_params_p;
        el->mode = TM_FUNC;
        el->pos_node = pnVar25;
        pnVar19 = (node_t_conflict)reg_malloc(c2m_ctx_00,0x20);
        (el->u).tag_type = pnVar19;
        bVar27 = false;
        pnVar19->attr = (void *)0x0;
        (pnVar19->op_link).next = (node_t)0x0;
        if (pnVar7 != (node_t_conflict)0x0) {
          bVar27 = pnVar7->code == N_DOTS;
        }
        *(undefined1 *)&pnVar19->code = (char)pnVar19->code & (N_ATTR|N_MODULE) | bVar27;
        if (bVar27 != false) {
          DLIST_node_t_remove(&(pnVar11->u).ops,pnVar7);
        }
        if (extraout_EDX == 0) {
          create_node_scope(c2m_ctx_00,pnVar25);
        }
        (pnVar19->op_link).prev = pnVar11;
        pcVar3->in_params_p = '\x01';
        pnVar7 = (pnVar11->u).ops.head;
        pnVar19 = pnVar7;
        if (pnVar7 == (node_t_conflict)0x0) {
joined_r0x0018892c:
          for (; pnVar19 != (node_t_conflict)0x0; pnVar19 = (pnVar19->op_link).next) {
            nVar2 = pnVar19->code;
            if (nVar2 == N_ID) {
              if (extraout_EDX == 0) {
                pVar28 = get_node_pos(c2m_ctx_00,pnVar19);
                error(c2m_ctx_00,0x1c21c1,pVar28.fname,pVar28._8_8_);
              }
            }
            else {
              if (pnVar19 != pnVar7) {
                check(c2m_ctx_00,pnVar19,pnVar25);
              }
              pdVar20 = get_param_decl_spec(pnVar19);
              adjust_param_type(c2m_ctx_00,&pdVar20->type);
            }
            if (nVar2 == N_ID) break;
          }
        }
        else {
          if (pnVar7->code != N_ID) {
            check(c2m_ctx_00,pnVar7,pnVar25);
          }
          if ((((pnVar7 == (node_t_conflict)0x0) || (pnVar7->code != N_TYPE)) ||
              (lVar22 = *(long *)((long)pnVar7->attr + 0x18), *(int *)(lVar22 + 0x18) != 1)) ||
             (*(int *)(lVar22 + 0x30) != 1)) goto joined_r0x0018892c;
          pbVar12 = (byte *)pnVar7->attr;
          if ((*pbVar12 & 0xef) == 0) {
            bVar27 = *(long *)(pbVar12 + 8) == 0;
          }
          else {
            bVar27 = false;
          }
          if ((((*pbVar12 & 0x10) != 0) || (!bVar27)) ||
             ((*(byte *)(*(long *)(pbVar12 + 0x18) + 0x14) & 0xf) != 0)) {
            pVar28 = get_node_pos(c2m_ctx_00,pnVar7);
            error(c2m_ctx_00,0x1c2188,pVar28.fname,pVar28._8_8_);
          }
          if ((pnVar7->op_link).next != (node_t)0x0) {
            pVar28 = get_node_pos(c2m_ctx_00,pnVar7);
            error(c2m_ctx_00,0x1c21a1,pVar28.fname,pVar28._8_8_);
          }
        }
        pcVar3->in_params_p = uVar1;
        if (extraout_EDX == 0) {
          c2m_ctx_00->check_ctx->curr_scope =
               *(node_t_conflict *)((long)c2m_ctx_00->check_ctx->curr_scope->attr + 0x20);
        }
      }
      else if (nVar2 == N_ARR) {
        pnVar11 = (pnVar25->u).ops.head;
        pnVar7 = (pnVar11->op_link).next;
        pnVar19 = (pnVar7->op_link).next;
        el->mode = TM_ARR;
        el->pos_node = pnVar25;
        paVar18 = (arr_type *)reg_malloc(c2m_ctx_00,0x20);
        (el->u).arr_type = paVar18;
        *(byte *)&paVar18->ind_type_qual = *(byte *)&paVar18->ind_type_qual & 0xf0;
        set_type_qual(c2m_ctx_00,pnVar7,&paVar18->ind_type_qual,TM_UNDEF);
        check(c2m_ctx_00,pnVar19,pnVar25);
        paVar18->size = pnVar19;
        *(byte *)paVar18 = *(byte *)paVar18 & 0xfe | pnVar11->code == N_STATIC;
        paVar18->el_type = (type *)0x0;
      }
      else {
        if (nVar2 != N_POINTER) {
          abort();
        }
        pnVar7 = (pnVar25->u).ops.head;
        el->mode = TM_PTR;
        el->pos_node = pnVar25;
        (el->u).tag_type = (node_t_conflict)0x0;
        set_type_qual(c2m_ctx_00,pnVar7,&el->type_qual,TM_PTR);
      }
      ptVar21 = append_type(ptVar21,el);
      pnVar25 = (pnVar25->op_link).next;
    } while (pnVar25 != (node_t)0x0);
  }
  return;
LAB_001886dd:
  process_func_decls_for_allocation_cold_2();
LAB_001886e2:
  process_func_decls_for_allocation_cold_5();
  piVar24 = in_RSI;
  goto LAB_001886e7;
}

Assistant:

static void process_func_decls_for_allocation (c2m_ctx_t c2m_ctx) {
  check_ctx_t check_ctx = c2m_ctx->check_ctx;
  size_t i, j;
  decl_t decl;
  struct type *type;
  struct node_scope *ns, *curr_ns;
  node_t scope;
  mir_size_t start_offset = 0; /* to remove an uninitialized warning */

  /* Exclude decls which will be in regs: */
  for (i = j = 0; i < VARR_LENGTH (decl_t, func_decls_for_allocation); i++) {
    decl = VARR_GET (decl_t, func_decls_for_allocation, i);
    type = decl->decl_spec.type;
    ns = decl->scope->attr;
    if (scalar_type_p (type)) {
      decl->reg_p = TRUE;
      continue;
    }
    VARR_SET (decl_t, func_decls_for_allocation, j, decl);
    j++;
  }
  VARR_TRUNC (decl_t, func_decls_for_allocation, j);
  qsort (VARR_ADDR (decl_t, func_decls_for_allocation), j, sizeof (decl_t), decl_cmp);
  scope = NULL;
  for (i = 0; i < VARR_LENGTH (decl_t, func_decls_for_allocation); i++) {
    decl = VARR_GET (decl_t, func_decls_for_allocation, i);
    type = decl->decl_spec.type;
    ns = decl->scope->attr;
    if (decl->scope != scope) { /* new scope: process upper scopes */
      for (scope = ns->scope; scope != top_scope; scope = curr_ns->scope) {
        curr_ns = scope->attr;
        ns->offset += curr_ns->size;
        curr_ns->stack_var_p = TRUE;
      }
      scope = decl->scope;
      ns->stack_var_p = TRUE;
      start_offset = ns->offset;
    }
    ns->offset = round_size (ns->offset, var_align (c2m_ctx, type));
    decl->offset = ns->offset;
    ns->offset += var_size (c2m_ctx, type);
    ns->size = ns->offset - start_offset;
  }
  scope = NULL;
  for (i = 0; i < VARR_LENGTH (decl_t, func_decls_for_allocation); i++) { /* update scope sizes: */
    decl = VARR_GET (decl_t, func_decls_for_allocation, i);
    ns = decl->scope->attr;
    if (decl->scope == scope) continue;
    /* new scope: update upper scope sizes */
    for (scope = ns->scope; scope != top_scope; scope = curr_ns->scope) {
      curr_ns = scope->attr;
      if (curr_ns->size < ns->offset) curr_ns->size = ns->offset;
      if (ns->stack_var_p) curr_ns->stack_var_p = TRUE;
    }
  }
}